

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

bool __thiscall
JsrtDebugManager::EnableAsyncBreak(JsrtDebugManager *this,ScriptContext *scriptContext)

{
  ProbeContainer *this_00;
  bool bVar1;
  DebugContext *pDVar2;
  DebuggingFlags *this_01;
  
  if (scriptContext->isDebugContextInitialized == true) {
    pDVar2 = Js::ScriptContext::GetDebugContext(scriptContext);
    this_00 = pDVar2->diagProbesContainer;
    bVar1 = Js::ProbeContainer::IsAsyncActivate(this_00);
    if (!bVar1) {
      Js::ProbeContainer::AsyncActivate(this_00,&this->super_HaltCallback);
      this_01 = Js::DebugManager::GetDebuggingFlags(scriptContext->threadContext->debugManager);
      DebuggingFlags::SetForceInterpreter(this_01,true);
    }
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool JsrtDebugManager::EnableAsyncBreak(Js::ScriptContext* scriptContext)
{
    if (!scriptContext->IsDebugContextInitialized())
    {
        // Although the script context exists, it hasn't been fully initialized yet.
        return false;
    }

    Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

    // This can be called when we are already at break
    if (!probeContainer->IsAsyncActivate())
    {
        probeContainer->AsyncActivate(this);

        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(true);
        return true;
    }
    return false;
}